

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O1

void cmime_base64_decode_file(FILE *infile,FILE *outfile)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  bool bVar8;
  char local_37 [4];
  byte local_33 [4];
  uchar in [4];
  uchar out [3];
  
  iVar2 = feof((FILE *)infile);
  if (iVar2 == 0) {
    lVar5 = 0;
    iVar2 = 0;
LAB_0010aa4e:
    do {
      iVar3 = feof((FILE *)infile);
      if (iVar3 == 0) {
        iVar3 = feof((FILE *)infile);
        if (iVar3 == 0) {
          do {
            uVar4 = getc((FILE *)infile);
            if ((uVar4 & 0xff) - 0x7b < 0xffffffb0) {
              cVar1 = '\0';
            }
            else {
              cVar1 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                      [(uVar4 & 0xff) - 0x2b];
            }
            cVar6 = cVar1 + -0x3d;
            if (cVar1 == '$') {
              cVar6 = '\0';
            }
            if (cVar1 == '\0') {
              cVar6 = '\0';
            }
            iVar3 = feof((FILE *)infile);
            bVar8 = cVar6 == '\0';
          } while ((iVar3 == 0) && (cVar6 == '\0'));
          cVar6 = cVar6 + -1;
        }
        else {
          bVar8 = true;
          cVar6 = -1;
        }
        iVar3 = feof((FILE *)infile);
        if (iVar3 == 0) {
          iVar2 = iVar2 + 1;
          if (!bVar8) goto LAB_0010aaee;
        }
        else {
          cVar6 = '\0';
LAB_0010aaee:
          local_37[lVar5] = cVar6;
        }
        lVar5 = lVar5 + 1;
        if (lVar5 != 4) goto LAB_0010aa4e;
      }
      if (iVar2 != 0) {
        local_33[0] = (byte)local_37[1] >> 4 | local_37[0] << 2;
        local_33[1] = (byte)local_37[2] >> 2 | local_37[1] << 4;
        local_33[2] = local_37[2] << 6 | local_37[3];
        if (1 < iVar2) {
          uVar7 = 0;
          do {
            putc((uint)local_33[uVar7],(FILE *)outfile);
            uVar7 = uVar7 + 1;
          } while (iVar2 - 1 != uVar7);
        }
      }
      iVar3 = feof((FILE *)infile);
      lVar5 = 0;
      iVar2 = 0;
    } while (iVar3 == 0);
  }
  return;
}

Assistant:

void cmime_base64_decode_file(FILE *infile, FILE *outfile) {
    unsigned char in[4], out[3], v;
    int i, len;

    while(!feof(infile)) {
        for(len = 0, i = 0; i < 4 && !feof(infile); i++) {
            v = 0;
            while(!feof(infile) && (v == 0)) {
                v = (unsigned char) getc( infile );
                v = (unsigned char) ((v < 43 || v > 122) ? 0 : cd64[ v - 43 ]);
                if( v ) {
                    v = (unsigned char) ((v == '$') ? 0 : v - 61);
                }
            }
            
            if(!feof(infile)) {
                len++;
                if(v) {
                    in[ i ] = (unsigned char) (v - 1);
                }
            } else {
                in[i] = 0;
            }
        }
        if(len) {
            cmime_base64_decode_block(in, out);
            for(i = 0; i < len - 1; i++) {
                putc(out[i], outfile);
            }
    }
    }
}